

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerformImplementation.hpp
# Opt level: O1

void InstructionSet::x86::
     perform<(InstructionSet::x86::DataSize)1,(InstructionSet::x86::AddressSize)0,InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (Instruction<false> *instruction,Context *context)

{
  uint16_t *puVar1;
  RegisterPair16 *pRVar2;
  ushort uVar3;
  uint32_t uVar4;
  uchar value;
  byte bVar5;
  uint8_t uVar6;
  type_conflict2 tVar7;
  read_t<IntT>_conflict rVar8;
  short sVar9;
  read_t<IntT>_conflict rVar10;
  uint16_t uVar11;
  unsigned_short uVar12;
  write_t<IntT>_conflict wVar13;
  modify_t<IntT>_conflict puVar14;
  modify_t<IntT>_conflict puVar15;
  ulong uVar16;
  uint uVar17;
  ushort uVar18;
  bool bVar19;
  anon_class_16_2_abe5e74a jcc;
  anon_class_24_3_3125e587 destination_rmw;
  anon_class_24_3_3125e587 source_r;
  anon_class_16_2_abe5e74a shift_count;
  IntT immediate;
  anon_class_24_3_3125e587 destination_w;
  anon_class_24_3_3125e587 destination_r;
  anon_class_24_3_3125e587 source_rmw;
  ushort local_c4;
  ImmediateT local_c2;
  anon_class_16_2_abe5e74a local_c0;
  anon_class_24_3_3125e587 local_b0;
  anon_class_24_3_3125e587 local_98;
  anon_class_16_2_abe5e74a local_80;
  IntT local_6a;
  anon_class_24_3_3125e587 local_68;
  anon_class_24_3_3125e587 local_50;
  anon_class_24_3_3125e587 local_38;
  
  local_98.instruction = instruction;
  local_98.context = context;
  local_98.immediate = &local_6a;
  local_38.instruction = instruction;
  local_38.context = context;
  local_38.immediate = &local_6a;
  local_50.instruction = instruction;
  local_50.context = context;
  local_50.immediate = &local_6a;
  local_68.instruction = instruction;
  local_68.context = context;
  local_68.immediate = &local_6a;
  local_b0.instruction = instruction;
  local_b0.context = context;
  local_b0.immediate = &local_6a;
  local_c0.instruction = instruction;
  local_c0.context = context;
  local_80.instruction = instruction;
  local_80.context = context;
  switch(instruction->operation_) {
  case Invalid:
  case ESC:
  case NOP:
    break;
  case AAA:
    Primitive::
    aaas<true,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (&(context->registers).ax_,context);
    break;
  case AAD:
    local_c4 = 0;
    local_c2 = instruction->extensions_[0];
    value = (context->registers).ax_.halves.high *
            *(char *)((long)&local_c4 + (ulong)(instruction->mem_exts_source_ >> 4 & 2)) +
            (context->registers).ax_.halves.low;
    (context->registers).ax_.halves.low = value;
    (context->registers).ax_.halves.high = '\0';
    Flags::
    set_from<unsigned_char,(InstructionSet::x86::Flag)7,(InstructionSet::x86::Flag)2,(InstructionSet::x86::Flag)8>
              (&context->flags,value);
    break;
  case AAM:
    local_c4 = 0;
    local_c2 = instruction->extensions_[0];
    Primitive::
    aam<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (&(context->registers).ax_,
               *(uint8_t *)((long)&local_c4 + (ulong)(instruction->mem_exts_source_ >> 4 & 2)),
               context);
    break;
  case AAS:
    Primitive::
    aaas<false,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (&(context->registers).ax_,context);
    break;
  case DAA:
    Primitive::
    daas<true,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ((uint8_t *)&context->registers,context);
    break;
  case DAS:
    Primitive::
    daas<false,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ((uint8_t *)&context->registers,context);
    break;
  case CBW:
    uVar3 = (context->registers).ax_.full;
    uVar18 = uVar3 | 0xff00;
    if (-1 < (char)uVar3) {
      uVar18 = uVar3 & 0x7f;
    }
    (context->registers).ax_.full = uVar18;
    break;
  case CWD:
    (context->registers).dx_.full =
         (unsigned_short)((uint)(int)(short)(context->registers).ax_.full >> 0xf);
    break;
  case HLT:
    (context->flow_controller).halted_ = true;
    break;
  case WAIT:
    puts("WAIT ????");
    break;
  case ADC:
    puVar14 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_24_3_3125e587::operator()(&local_b0);
    rVar10 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
             ::anon_class_24_3_3125e587::operator()(&local_98);
    Primitive::
    add<true,unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (puVar14,rVar10,context);
    goto LAB_0038b63e;
  case ADD:
    puVar14 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_24_3_3125e587::operator()(&local_b0);
    rVar10 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
             ::anon_class_24_3_3125e587::operator()(&local_98);
    Primitive::
    add<false,unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (puVar14,rVar10,context);
    goto LAB_0038b63e;
  case SBB:
    puVar14 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_24_3_3125e587::operator()(&local_b0);
    rVar10 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
             ::anon_class_24_3_3125e587::operator()(&local_98);
    Primitive::
    sub<true,(InstructionSet::x86::AccessType)2,unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (puVar14,rVar10,context);
    goto LAB_0038b63e;
  case SUB:
    puVar14 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_24_3_3125e587::operator()(&local_b0);
    rVar10 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
             ::anon_class_24_3_3125e587::operator()(&local_98);
    Primitive::
    sub<false,(InstructionSet::x86::AccessType)2,unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (puVar14,rVar10,context);
    goto LAB_0038b63e;
  case MUL:
    rVar10 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
             ::anon_class_24_3_3125e587::operator()(&local_98);
    uVar3 = (context->registers).ax_.full;
    uVar17 = (uint)rVar10 * (uint)uVar3;
    (context->registers).dx_.full = (unsigned_short)(uVar17 >> 0x10);
    (context->registers).ax_.full = rVar10 * uVar3;
    Flags::set_from<unsigned_int,(InstructionSet::x86::Flag)3,(InstructionSet::x86::Flag)0>
              (&context->flags,uVar17 >> 0x10);
    break;
  case IMUL_1:
    rVar10 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
             ::anon_class_24_3_3125e587::operator()(&local_98);
    Primitive::
    imul<unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (&(context->registers).dx_.full,(modify_t<unsigned_short>)&context->registers,rVar10,
               context);
    break;
  case DIV:
    rVar10 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
             ::anon_class_24_3_3125e587::operator()(&local_98);
    Primitive::
    div<unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (&(context->registers).dx_.full,(modify_t<unsigned_short>)&context->registers,rVar10,
               context);
    break;
  case IDIV:
    rVar10 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
             ::anon_class_24_3_3125e587::operator()(&local_98);
    Primitive::
    idiv<false,unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (&(context->registers).dx_.full,(modify_t<unsigned_short>)&context->registers,rVar10,
               context);
    break;
  case INC:
    puVar14 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_24_3_3125e587::operator()(&local_b0);
    Primitive::
    inc<unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (puVar14,context);
    goto LAB_0038b63e;
  case DEC:
    puVar14 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_24_3_3125e587::operator()(&local_b0);
    Primitive::
    dec<unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (puVar14,context);
    goto LAB_0038b63e;
  case IN:
    bVar5 = instruction->mem_exts_source_;
    if (("\x1f\x1f\x1f\x18"[bVar5 >> 3 & 3] & bVar5) == 0xf) {
      local_c4 = 0;
      local_c2 = *(ImmediateT *)((long)instruction->extensions_ + (ulong)(bVar5 >> 4 & 2));
      uVar11 = (&local_c4)[bVar5 >> 6 & 1];
    }
    else {
      uVar11 = (context->registers).dx_.full;
    }
    uVar12 = PCCompatible::IO<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::
             in<unsigned_short>(&context->io,uVar11);
    (context->registers).ax_.full = uVar12;
    break;
  case OUT:
    if (((byte)instruction->source_data_dest_sib_ &
        "\x1f\x1f\x1f\x18"[instruction->source_data_dest_sib_ >> 3 & 3]) == 0xf) {
      local_c4 = 0;
      local_c2 = *(ImmediateT *)
                  ((long)instruction->extensions_ + (ulong)(instruction->mem_exts_source_ >> 4 & 2))
      ;
      uVar11 = *(uint16_t *)((long)&local_c4 + (ulong)(instruction->mem_exts_source_ >> 5 & 2));
    }
    else {
      uVar11 = (context->registers).dx_.full;
    }
    PCCompatible::IO<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::out<unsigned_short>
              (&context->io,uVar11,(context->registers).ax_.full);
    break;
  case JO:
    bVar19 = (context->flags).overflow_ == 0;
    goto LAB_0038b184;
  case JNO:
    bVar19 = (context->flags).overflow_ == 0;
    goto LAB_0038b3b2;
  case JB:
    bVar19 = (context->flags).carry_ == 0;
    goto LAB_0038b184;
  case JNB:
    bVar19 = (context->flags).carry_ == 0;
    goto LAB_0038b3b2;
  case JZ:
    bVar19 = (context->flags).zero_ == 0;
    goto LAB_0038b3b2;
  case JNZ:
    bVar19 = (context->flags).zero_ == 0;
    goto LAB_0038b184;
  case JBE:
    bVar19 = (context->flags).carry_ != 0 || (context->flags).zero_ == 0;
    goto LAB_0038b3b2;
  case JNBE:
    bVar19 = (context->flags).carry_ == 0 && (context->flags).zero_ != 0;
    goto LAB_0038b3b2;
  case JS:
    bVar19 = (context->flags).sign_ == 0;
LAB_0038b184:
    bVar19 = !bVar19;
    goto LAB_0038b3b2;
  case JNS:
    bVar19 = (context->flags).sign_ == 0;
    goto LAB_0038b3b2;
  case JP:
    uVar17 = (context->flags).parity_;
    uVar17 = uVar17 >> 4 ^ uVar17;
    uVar17 = uVar17 >> 2 ^ uVar17;
    bVar19 = ((uVar17 >> 1 ^ uVar17) & 1) == 0;
    goto LAB_0038b3b2;
  case JNP:
    uVar17 = (context->flags).parity_;
    uVar17 = uVar17 >> 4 ^ uVar17;
    uVar17 = uVar17 >> 2 ^ uVar17;
    bVar19 = (bool)(((byte)(uVar17 >> 1) ^ (byte)uVar17) & 1);
    goto LAB_0038b3b2;
  case JL:
    uVar4 = (context->flags).sign_;
    bVar19 = (context->flags).overflow_ != 0;
    goto LAB_0038b3ad;
  case JNL:
    uVar4 = (context->flags).sign_;
    bVar19 = (context->flags).overflow_ == 0;
LAB_0038b3ad:
    bVar19 = (bool)(bVar19 ^ uVar4 != 0);
    goto LAB_0038b3b2;
  case JLE:
    if ((context->flags).zero_ == 0) {
      bVar19 = true;
    }
    else {
      bVar19 = ((context->flags).overflow_ != 0) != ((context->flags).sign_ != 0);
    }
    goto LAB_0038b3b2;
  case JNLE:
    if ((context->flags).zero_ == 0) {
      bVar19 = false;
    }
    else {
      bVar19 = ((context->flags).overflow_ == 0) != ((context->flags).sign_ != 0);
    }
    goto LAB_0038b3b2;
  case CALLabs:
    rVar10 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
             ::anon_class_24_3_3125e587::operator()(&local_50);
    Primitive::
    push<unsigned_short,false,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (&(context->registers).ip_,context);
    goto LAB_0038b362;
  case CALLrel:
    local_c4 = 0;
    local_c2 = *(undefined2 *)
                ((long)instruction->extensions_ + (ulong)(instruction->mem_exts_source_ >> 4 & 2));
    sVar9 = *(short *)((long)&local_c4 + (ulong)(instruction->mem_exts_source_ >> 5 & 2));
    Primitive::
    push<unsigned_short,false,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (&(context->registers).ip_,context);
    rVar10 = sVar9 + (context->registers).ip_;
LAB_0038b362:
    ((context->flow_controller).registers_)->ip_ = rVar10;
    break;
  case CALLfar:
    Primitive::
    call_far<unsigned_short,InstructionSet::x86::Instruction<false>const,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (instruction,context);
    break;
  case IRET:
    Primitive::
    iret<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (context);
    break;
  case RETfar:
    Primitive::
    ret_far<InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (*instruction,context);
    break;
  case RETnear:
    Primitive::
    ret_near<InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (*instruction,context);
    break;
  case JMPabs:
    rVar10 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
             ::anon_class_24_3_3125e587::operator()(&local_50);
    goto LAB_0038b414;
  case JMPrel:
    local_c4 = 0;
    local_c2 = *(undefined2 *)
                ((long)instruction->extensions_ + (ulong)(instruction->mem_exts_source_ >> 4 & 2));
    sVar9 = *(short *)((long)&local_c4 + (ulong)(instruction->mem_exts_source_ >> 5 & 2));
    goto LAB_0038b410;
  case JMPfar:
    Primitive::
    jump_far<InstructionSet::x86::Instruction<false>const,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (instruction,context);
    break;
  case JCXZ:
    bVar19 = (context->registers).cx_.full == 0;
LAB_0038b3b2:
    perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
    ::anon_class_16_2_abe5e74a::operator()(&local_c0,bVar19);
    break;
  case INT:
    local_c4 = 0;
    local_c2 = instruction->extensions_[0];
    uVar17 = (uint)*(ushort *)((long)&local_c4 + (ulong)(instruction->mem_exts_source_ >> 4 & 2));
    goto LAB_0038b45e;
  case INTO:
    if ((context->flags).overflow_ == 0) {
      return;
    }
    uVar17 = 4;
LAB_0038b45e:
    interrupt<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (uVar17,context);
    break;
  case LAHF:
    Primitive::
    lahf<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (&(context->registers).ax_.halves.high,context);
    break;
  case SAHF:
    Primitive::
    sahf<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (&(context->registers).ax_.halves.high,context);
    break;
  case LDS:
    wVar13 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
             ::anon_class_24_3_3125e587::operator()(&local_68);
    Primitive::
    ld<(InstructionSet::x86::Source)11,InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (instruction,(write_t<uint16_t>)wVar13.target_,context);
    (context->segments).ds_base_ = (uint)((context->segments).registers_)->ds_ << 4;
    break;
  case LES:
    wVar13 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
             ::anon_class_24_3_3125e587::operator()(&local_68);
    Primitive::
    ld<(InstructionSet::x86::Source)8,InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (instruction,(write_t<uint16_t>)wVar13.target_,context);
    (context->segments).es_base_ = (uint)((context->segments).registers_)->es_ << 4;
    break;
  case LEA:
    wVar13 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
             ::anon_class_24_3_3125e587::operator()(&local_68);
    Primitive::
    lea<unsigned_short,InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (instruction,(write_t<unsigned_short>)wVar13.target_,context);
    break;
  case MOVS:
    Primitive::
    movs<unsigned_short,unsigned_short,(InstructionSet::x86::Repetition)0,InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (instruction,&(context->registers).cx_.full,&(context->registers).si_,
               &(context->registers).di_,context);
    goto LAB_0038b63e;
  case MOVS_REP:
    Primitive::
    movs<unsigned_short,unsigned_short,(InstructionSet::x86::Repetition)3,InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (instruction,&(context->registers).cx_.full,&(context->registers).si_,
               &(context->registers).di_,context);
    goto LAB_0038b63e;
  case LODS:
    Primitive::
    lods<unsigned_short,unsigned_short,(InstructionSet::x86::Repetition)0,InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (instruction,&(context->registers).cx_.full,&(context->registers).si_,
               (unsigned_short *)&context->registers,context);
    break;
  case LODS_REP:
    Primitive::
    lods<unsigned_short,unsigned_short,(InstructionSet::x86::Repetition)3,InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (instruction,&(context->registers).cx_.full,&(context->registers).si_,
               (unsigned_short *)&context->registers,context);
    break;
  case STOS:
    Primitive::
    stos<unsigned_short,unsigned_short,(InstructionSet::x86::Repetition)0,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (&(context->registers).cx_.full,&(context->registers).di_,
               (unsigned_short *)&context->registers,context);
    goto LAB_0038b63e;
  case STOS_REP:
    Primitive::
    stos<unsigned_short,unsigned_short,(InstructionSet::x86::Repetition)3,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (&(context->registers).cx_.full,&(context->registers).di_,
               (unsigned_short *)&context->registers,context);
    goto LAB_0038b63e;
  case CMPS:
    Primitive::
    cmps<unsigned_short,unsigned_short,(InstructionSet::x86::Repetition)0,InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (instruction,&(context->registers).cx_.full,&(context->registers).si_,
               &(context->registers).di_,context);
    break;
  case CMPS_REPE:
    Primitive::
    cmps<unsigned_short,unsigned_short,(InstructionSet::x86::Repetition)1,InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (instruction,&(context->registers).cx_.full,&(context->registers).si_,
               &(context->registers).di_,context);
    break;
  case CMPS_REPNE:
    Primitive::
    cmps<unsigned_short,unsigned_short,(InstructionSet::x86::Repetition)2,InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (instruction,&(context->registers).cx_.full,&(context->registers).si_,
               &(context->registers).di_,context);
    break;
  case SCAS:
    Primitive::
    scas<unsigned_short,unsigned_short,(InstructionSet::x86::Repetition)0,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (&(context->registers).cx_.full,&(context->registers).di_,
               (unsigned_short *)&context->registers,context);
    break;
  case SCAS_REPE:
    Primitive::
    scas<unsigned_short,unsigned_short,(InstructionSet::x86::Repetition)1,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (&(context->registers).cx_.full,&(context->registers).di_,
               (unsigned_short *)&context->registers,context);
    break;
  case SCAS_REPNE:
    Primitive::
    scas<unsigned_short,unsigned_short,(InstructionSet::x86::Repetition)2,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (&(context->registers).cx_.full,&(context->registers).di_,
               (unsigned_short *)&context->registers,context);
    break;
  case LOOP:
    local_c4 = 0;
    local_c2 = *(undefined2 *)
                ((long)instruction->extensions_ + (ulong)(instruction->mem_exts_source_ >> 4 & 2));
    sVar9 = *(short *)((long)&local_c4 + (ulong)(instruction->mem_exts_source_ >> 5 & 2));
    pRVar2 = &(context->registers).cx_;
    pRVar2->full = pRVar2->full - 1;
    if (pRVar2->full == 0) {
      return;
    }
    goto LAB_0038b410;
  case LOOPE:
    local_c4 = 0;
    local_c2 = *(undefined2 *)
                ((long)instruction->extensions_ + (ulong)(instruction->mem_exts_source_ >> 4 & 2));
    sVar9 = *(short *)((long)&local_c4 + (ulong)(instruction->mem_exts_source_ >> 5 & 2));
    pRVar2 = &(context->registers).cx_;
    pRVar2->full = pRVar2->full - 1;
    if (pRVar2->full == 0) {
      return;
    }
    if ((context->flags).zero_ != 0) {
      return;
    }
    goto LAB_0038b410;
  case LOOPNE:
    local_c4 = 0;
    local_c2 = *(undefined2 *)
                ((long)instruction->extensions_ + (ulong)(instruction->mem_exts_source_ >> 4 & 2));
    sVar9 = *(short *)((long)&local_c4 + (ulong)(instruction->mem_exts_source_ >> 5 & 2));
    pRVar2 = &(context->registers).cx_;
    pRVar2->full = pRVar2->full - 1;
    if (pRVar2->full == 0) {
      return;
    }
    if ((context->flags).zero_ == 0) {
      return;
    }
LAB_0038b410:
    rVar10 = sVar9 + (context->registers).ip_;
LAB_0038b414:
    ((context->flow_controller).registers_)->ip_ = rVar10;
    break;
  case MOV:
    wVar13 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
             ::anon_class_24_3_3125e587::operator()(&local_68);
    rVar10 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
             ::anon_class_24_3_3125e587::operator()(&local_98);
    *wVar13.target_ = rVar10;
    goto LAB_0038b486;
  case NEG:
    puVar14 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_24_3_3125e587::operator()(&local_38);
    Primitive::
    neg<unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (puVar14,context);
    goto LAB_0038b63e;
  case NOT:
    puVar14 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_24_3_3125e587::operator()(&local_38);
    *puVar14 = ~*puVar14;
    goto LAB_0038b63e;
  case AND:
    puVar14 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_24_3_3125e587::operator()(&local_b0);
    rVar10 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
             ::anon_class_24_3_3125e587::operator()(&local_98);
    Primitive::
    and_<unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (puVar14,rVar10,context);
    goto LAB_0038b63e;
  case OR:
    puVar14 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_24_3_3125e587::operator()(&local_b0);
    rVar10 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
             ::anon_class_24_3_3125e587::operator()(&local_98);
    Primitive::
    or_<unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (puVar14,rVar10,context);
    goto LAB_0038b63e;
  case XOR:
    puVar14 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_24_3_3125e587::operator()(&local_b0);
    rVar10 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
             ::anon_class_24_3_3125e587::operator()(&local_98);
    Primitive::
    xor_<unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (puVar14,rVar10,context);
    goto LAB_0038b63e;
  case POP:
    tVar7 = PCCompatible::Memory::access<unsigned_short,(InstructionSet::x86::AccessType)0>
                      (&context->memory,SS,(context->registers).sp_);
    puVar1 = &(context->registers).sp_;
    *puVar1 = *puVar1 + 2;
    wVar13 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
             ::anon_class_24_3_3125e587::operator()(&local_68);
    *wVar13.target_ = tVar7;
LAB_0038b486:
    PCCompatible::Segments::did_update
              (&context->segments,
               (Source)instruction->source_data_dest_sib_ &
               "\x1f\x1f\x1f\x18"[instruction->source_data_dest_sib_ >> 3 & 3]);
    goto LAB_0038b63e;
  case POPF:
    Primitive::
    popf<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (context);
    break;
  case PUSH:
    puVar14 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_24_3_3125e587::operator()(&local_38);
    Primitive::
    push<unsigned_short,false,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (puVar14,context);
    goto LAB_0038b63e;
  case PUSHF:
    Primitive::
    pushf<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (context);
    break;
  case RCL:
    puVar14 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_24_3_3125e587::operator()(&local_b0);
    uVar6 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
            ::anon_class_16_2_abe5e74a::operator()(&local_80);
    Primitive::
    rcl<unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (puVar14,uVar6,context);
    goto LAB_0038b63e;
  case RCR:
    puVar14 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_24_3_3125e587::operator()(&local_b0);
    uVar6 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
            ::anon_class_16_2_abe5e74a::operator()(&local_80);
    Primitive::
    rcr<unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (puVar14,uVar6,context);
    goto LAB_0038b63e;
  case ROL:
    puVar14 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_24_3_3125e587::operator()(&local_b0);
    bVar5 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
            ::anon_class_16_2_abe5e74a::operator()(&local_80);
    if (bVar5 != 0) {
      if ((bVar5 & 0xf) != 0) {
        *puVar14 = *puVar14 << (bVar5 & 0xf) | *puVar14 >> 0x10 - (bVar5 & 0xf);
      }
      uVar3 = *puVar14;
      uVar17 = uVar3 & 1;
      (context->flags).carry_ = uVar17;
      (context->flags).overflow_ = uVar3 >> 0xf ^ uVar17;
    }
    goto LAB_0038b63e;
  case ROR:
    puVar14 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_24_3_3125e587::operator()(&local_b0);
    bVar5 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
            ::anon_class_16_2_abe5e74a::operator()(&local_80);
    if (bVar5 != 0) {
      if ((bVar5 & 0xf) != 0) {
        *puVar14 = *puVar14 >> (bVar5 & 0xf) | *puVar14 << 0x10 - (bVar5 & 0xf);
      }
      uVar3 = *puVar14;
      (context->flags).carry_ = uVar3 & 0x8000;
      (context->flags).overflow_ = ((uint)uVar3 + (uint)uVar3 ^ (uint)uVar3) & 0x8000;
    }
    goto LAB_0038b63e;
  case SAL:
    puVar14 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_24_3_3125e587::operator()(&local_b0);
    uVar6 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
            ::anon_class_16_2_abe5e74a::operator()(&local_80);
    Primitive::
    sal<unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (puVar14,uVar6,context);
    goto LAB_0038b63e;
  case SAR:
    puVar14 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_24_3_3125e587::operator()(&local_b0);
    uVar6 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
            ::anon_class_16_2_abe5e74a::operator()(&local_80);
    Primitive::
    sar<unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (puVar14,uVar6,context);
    goto LAB_0038b63e;
  case SHR:
    puVar14 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_24_3_3125e587::operator()(&local_b0);
    uVar6 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
            ::anon_class_16_2_abe5e74a::operator()(&local_80);
    Primitive::
    shr<unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (puVar14,uVar6,context);
    goto LAB_0038b63e;
  case CLC:
    (context->flags).carry_ = 0;
    break;
  case CLD:
    (context->flags).direction_ = 1;
    break;
  case CLI:
    (context->flags).interrupt_ = 0;
    break;
  case STC:
    (context->flags).carry_ = 1;
    break;
  case STD:
    (context->flags).direction_ = -1;
    break;
  case STI:
    (context->flags).interrupt_ = 1;
    break;
  case CMC:
    (context->flags).carry_ = (uint)((context->flags).carry_ == 0);
    break;
  case CMP:
    rVar10 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
             ::anon_class_24_3_3125e587::operator()(&local_50);
    rVar8 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
            ::anon_class_24_3_3125e587::operator()(&local_98);
    Primitive::
    sub<false,(InstructionSet::x86::AccessType)0,unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (rVar10,rVar8,context);
    break;
  case TEST:
    rVar10 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
             ::anon_class_24_3_3125e587::operator()(&local_50);
    rVar8 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
            ::anon_class_24_3_3125e587::operator()(&local_98);
    Flags::set_from<unsigned_int,(InstructionSet::x86::Flag)0,(InstructionSet::x86::Flag)3>
              (&context->flags,0);
    Flags::
    set_from<unsigned_short,(InstructionSet::x86::Flag)7,(InstructionSet::x86::Flag)2,(InstructionSet::x86::Flag)8>
              (&context->flags,rVar8 & rVar10);
    break;
  case XCHG:
    puVar14 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_24_3_3125e587::operator()(&local_b0);
    puVar15 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ::anon_class_24_3_3125e587::operator()(&local_38);
    uVar12 = *puVar14;
    *puVar14 = *puVar15;
    *puVar15 = uVar12;
    goto LAB_0038b63e;
  case XLAT:
    Primitive::
    xlat<unsigned_short,InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (instruction,context);
    break;
  case SALC:
    (context->registers).ax_.halves.low = -((context->flags).carry_ != 0);
    break;
  case BOUND:
    if ((context->registers).cx_.halves.low != '\0') goto switchD_0038a995_caseD_67;
    goto LAB_0038b63e;
  case ENTER:
switchD_0038a995_caseD_67:
    wVar13 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
             ::anon_class_24_3_3125e587::operator()(&local_68);
    Primitive::
    setmo<unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              ((write_t<unsigned_short>)wVar13.target_,context);
    goto LAB_0038b63e;
  case IDIV_REP:
    rVar10 = perform<(InstructionSet::x86::DataSize)1,_(InstructionSet::x86::AddressSize)0,_InstructionSet::x86::Instruction<false>,_PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
             ::anon_class_24_3_3125e587::operator()(&local_98);
    Primitive::
    idiv<true,unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (&(context->registers).dx_.full,(modify_t<unsigned_short>)&context->registers,rVar10,
               context);
    goto LAB_0038b63e;
  case INS:
    Primitive::
    ins<unsigned_short,unsigned_short,(InstructionSet::x86::Repetition)0,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (&(context->registers).cx_.full,(context->registers).dx_.full,
               &(context->registers).di_,context);
    goto LAB_0038b63e;
  case INS_REP:
    Primitive::
    ins<unsigned_short,unsigned_short,(InstructionSet::x86::Repetition)3,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (&(context->registers).cx_.full,(context->registers).dx_.full,
               &(context->registers).di_,context);
LAB_0038b63e:
    uVar16 = (ulong)(context->memory).write_back_address_[0];
    if (uVar16 != 0) {
      (context->memory).memory._M_elems[uVar16] = (uchar)(context->memory).write_back_value_;
      (context->memory).memory._M_elems[(context->memory).write_back_address_[1]] =
           *(uchar *)((long)&(context->memory).write_back_value_ + 1);
      (context->memory).write_back_address_[0] = 0;
    }
    break;
  case OUTS:
    Primitive::
    outs<unsigned_short,unsigned_short,(InstructionSet::x86::Repetition)0,InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (instruction,&(context->registers).cx_.full,(context->registers).dx_.full,
               &(context->registers).si_,context);
    break;
  case OUTS_REP:
    Primitive::
    outs<unsigned_short,unsigned_short,(InstructionSet::x86::Repetition)3,InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (instruction,&(context->registers).cx_.full,(context->registers).dx_.full,
               &(context->registers).si_,context);
    break;
  case PUSHA:
    Primitive::
    pusha<unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (context);
    break;
  case POPA:
    Primitive::
    popa<unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
              (context);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/PCCompatible/../../InstructionSets/x86/Implementation/PerformImplementation.hpp"
                  ,0xac,
                  "void InstructionSet::x86::perform(const InstructionT &, ContextT &) [data_size = InstructionSet::x86::DataSize::Word, address_size = InstructionSet::x86::AddressSize::b16, InstructionT = InstructionSet::x86::Instruction<false>, ContextT = PCCompatible::ConcreteMachine<Analyser::Static::PCCompatible::Target::VideoAdaptor::MDA>::Context]"
                 );
  }
  return;
}

Assistant:

void perform(
	const InstructionT &instruction,
	ContextT &context
) {
	using IntT = typename DataSizeType<data_size>::type;
	using AddressT = typename AddressSizeType<address_size>::type;

	// Establish source() and destination() shorthands to fetch data if necessary.
	//
	// C++17, which this project targets at the time of writing, does not provide templatised lambdas.
	// So the following division is in part a necessity.
	//
	// (though GCC offers C++20 syntax as an extension, and Clang seems to follow along, so maybe I'm overthinking)
	IntT immediate;
	const auto source_r = [&]() -> read_t<IntT> {
		return resolve<IntT, AccessType::Read>(
			instruction,
			instruction.source().source(),
			instruction.source(),
			context,
			nullptr,
			&immediate);
	};
	const auto source_rmw = [&]() -> modify_t<IntT> {
		return resolve<IntT, AccessType::ReadModifyWrite>(
			instruction,
			instruction.source().source(),
			instruction.source(),
			context,
			nullptr,
			&immediate);
	};
	const auto destination_r = [&]() -> read_t<IntT> {
		return resolve<IntT, AccessType::Read>(
			instruction,
			instruction.destination().source(),
			instruction.destination(),
			context,
			nullptr,
			&immediate);
	};
	const auto destination_w = [&]() -> write_t<IntT> {
		return resolve<IntT, AccessType::Write>(
			instruction,
			instruction.destination().source(),
			instruction.destination(),
			context,
			nullptr,
			&immediate);
	};
	const auto destination_rmw = [&]() -> modify_t<IntT> {
		return resolve<IntT, AccessType::ReadModifyWrite>(
			instruction,
			instruction.destination().source(),
			instruction.destination(),
			context,
			nullptr,
			&immediate);
	};

	// Performs a displacement jump only if @c condition is true.
	const auto jcc = [&](bool condition) {
		Primitive::jump(
			condition,
			instruction.displacement(),
			context);
	};

	const auto shift_count = [&]() -> uint8_t {
		static constexpr uint8_t mask = (ContextT::model != Model::i8086) ? 0x1f : 0xff;
		switch(instruction.source().source()) {
			case Source::None:		return 1;
			case Source::Immediate:	return uint8_t(instruction.operand()) & mask;
			default:				return context.registers.cl() & mask;
		}
	};

	// Some instructions use a pair of registers as an extended accumulator — DX:AX or EDX:EAX.
	// The two following return the high and low parts of that pair; they also work in Byte mode to return AH:AL,
	// i.e. AX split into high and low parts.
	const auto pair_high = [&]() -> IntT& {
		if constexpr (data_size == DataSize::Byte) 			return context.registers.ah();
		else if constexpr (data_size == DataSize::Word)		return context.registers.dx();
		else if constexpr (data_size == DataSize::DWord)	return context.registers.edx();
	};
	const auto pair_low = [&]() -> IntT& {
		if constexpr (data_size == DataSize::Byte) 			return context.registers.al();
		else if constexpr (data_size == DataSize::Word)		return context.registers.ax();
		else if constexpr (data_size == DataSize::DWord)	return context.registers.eax();
	};

	// For the string operations, evaluate to either SI and DI or ESI and EDI, depending on the address size.
	const auto eSI = [&]() -> AddressT& {
		if constexpr (std::is_same_v<AddressT, uint16_t>) {
			return context.registers.si();
		} else {
			return context.registers.esi();
		}
	};
	const auto eDI = [&]() -> AddressT& {
		if constexpr (std::is_same_v<AddressT, uint16_t>) {
			return context.registers.di();
		} else {
			return context.registers.edi();
		}
	};

	// For counts, provide either eCX or CX depending on address size.
	const auto eCX = [&]() -> AddressT& {
		if constexpr (std::is_same_v<AddressT, uint16_t>) {
			return context.registers.cx();
		} else {
			return context.registers.ecx();
		}
	};

	// Gets the port for an IN or OUT; these are always 16-bit.
	const auto port = [&](Source source) -> uint16_t {
		switch(source) {
			case Source::DirectAddress:	return instruction.offset();
			default:					return context.registers.dx();
		}
	};

	// Guide to the below:
	//
	//	* use hard-coded register names where appropriate, otherwise use the source_X() and destination_X() lambdas;
	//	* return directly if there is definitely no possible write back to RAM;
	//	* break if there's a chance of writeback.
	switch(instruction.operation()) {
		default:
			assert(false);

		case Operation::Invalid:
			// TODO: throw on higher-order processors.
		case Operation::ESC:
		case Operation::NOP:	return;

		case Operation::AAM:	Primitive::aam(context.registers.axp(), uint8_t(instruction.operand()), context);	return;
		case Operation::AAD:	Primitive::aad(context.registers.axp(), uint8_t(instruction.operand()), context);	return;
		case Operation::AAA:	Primitive::aaas<true>(context.registers.axp(), context);					return;
		case Operation::AAS:	Primitive::aaas<false>(context.registers.axp(), context);					return;
		case Operation::DAA:	Primitive::daas<true>(context.registers.al(), context);						return;
		case Operation::DAS:	Primitive::daas<false>(context.registers.al(), context);					return;

		case Operation::CBW:	Primitive::cbw(pair_low());					return;
		case Operation::CWD:	Primitive::cwd(pair_high(), pair_low());	return;

		case Operation::HLT:	context.flow_controller.halt();		return;
		case Operation::WAIT:	context.flow_controller.wait();		return;

		case Operation::ADC:
			Primitive::add<true, IntT>(destination_rmw(), source_r(), context);
		break;
		case Operation::ADD:
			Primitive::add<false, IntT>(destination_rmw(), source_r(), context);
		break;
		case Operation::SBB:
			Primitive::sub<true, AccessType::ReadModifyWrite, IntT>(destination_rmw(), source_r(), context);
		break;
		case Operation::SUB:
			Primitive::sub<false, AccessType::ReadModifyWrite, IntT>(destination_rmw(), source_r(), context);
		break;
		case Operation::CMP:
			Primitive::sub<false, AccessType::Read, IntT>(destination_r(), source_r(), context);
		return;
		case Operation::TEST:
			Primitive::test<IntT>(destination_r(), source_r(), context);
		return;

		case Operation::MUL:		Primitive::mul<IntT>(pair_high(), pair_low(), source_r(), context);			return;
		case Operation::IMUL_1:		Primitive::imul<IntT>(pair_high(), pair_low(), source_r(), context);		return;
		case Operation::DIV:		Primitive::div<IntT>(pair_high(), pair_low(), source_r(), context);			return;
		case Operation::IDIV:		Primitive::idiv<false, IntT>(pair_high(), pair_low(), source_r(), context);	return;
		case Operation::IDIV_REP:
			if constexpr (ContextT::model == Model::i8086) {
				Primitive::idiv<true, IntT>(pair_high(), pair_low(), source_r(), context);
				break;
			} else {
				static_assert(int(Operation::IDIV_REP) == int(Operation::LEAVE));
				if constexpr (std::is_same_v<IntT, uint16_t> || std::is_same_v<IntT, uint32_t>) {
					Primitive::leave<IntT>();
				}
			}
		return;

		case Operation::INC:	Primitive::inc<IntT>(destination_rmw(), context);		break;
		case Operation::DEC:	Primitive::dec<IntT>(destination_rmw(), context);		break;

		case Operation::AND:	Primitive::and_<IntT>(destination_rmw(), source_r(), context);		break;
		case Operation::OR:		Primitive::or_<IntT>(destination_rmw(), source_r(), context);		break;
		case Operation::XOR:	Primitive::xor_<IntT>(destination_rmw(), source_r(), context);		break;
		case Operation::NEG:	Primitive::neg<IntT>(source_rmw(), context);						break;	// TODO: should be a destination.
		case Operation::NOT:	Primitive::not_<IntT>(source_rmw());								break;	// TODO: should be a destination.

		case Operation::CALLrel:
			Primitive::call_relative<AddressT>(instruction.displacement(), context);
		return;
		case Operation::CALLabs:	Primitive::call_absolute<IntT, AddressT>(destination_r(), context);					return;
		case Operation::CALLfar:	Primitive::call_far<AddressT>(instruction, context);									return;

		case Operation::JMPrel:	jcc(true);														return;
		case Operation::JMPabs:	Primitive::jump_absolute<IntT>(destination_r(), context);		return;
		case Operation::JMPfar:	Primitive::jump_far(instruction, context);						return;

		case Operation::JCXZ:	jcc(!eCX());														return;
		case Operation::LOOP:	Primitive::loop<AddressT>(eCX(), instruction.offset(), context);	return;
		case Operation::LOOPE:	Primitive::loope<AddressT>(eCX(), instruction.offset(), context);	return;
		case Operation::LOOPNE:	Primitive::loopne<AddressT>(eCX(), instruction.offset(), context);	return;

		case Operation::IRET:		Primitive::iret(context);					return;
		case Operation::RETnear:	Primitive::ret_near(instruction, context);	return;
		case Operation::RETfar:		Primitive::ret_far(instruction, context);	return;

		case Operation::INT:	interrupt(instruction.operand(), context);		return;
		case Operation::INTO:	Primitive::into(context);						return;

		case Operation::SAHF:	Primitive::sahf(context.registers.ah(), context);		return;
		case Operation::LAHF:	Primitive::lahf(context.registers.ah(), context);		return;

		case Operation::LDS:
			if constexpr (data_size == DataSize::Word) {
				Primitive::ld<Source::DS>(instruction, destination_w(), context);
				context.segments.did_update(Source::DS);
			}
		return;
		case Operation::LES:
			if constexpr (data_size == DataSize::Word) {
				Primitive::ld<Source::ES>(instruction, destination_w(), context);
				context.segments.did_update(Source::ES);
			}
		return;

		case Operation::LEA:	Primitive::lea<IntT>(instruction, destination_w(), context);	return;
		case Operation::MOV:
			Primitive::mov<IntT>(destination_w(), source_r());
			if constexpr (std::is_same_v<IntT, uint16_t>) {
				context.segments.did_update(instruction.destination().source());
			}
		break;

		case Operation::JO:		jcc(context.flags.template condition<Condition::Overflow>());		return;
		case Operation::JNO:	jcc(!context.flags.template condition<Condition::Overflow>());		return;
		case Operation::JB:		jcc(context.flags.template condition<Condition::Below>());			return;
		case Operation::JNB:	jcc(!context.flags.template condition<Condition::Below>());			return;
		case Operation::JZ:		jcc(context.flags.template condition<Condition::Zero>());			return;
		case Operation::JNZ:	jcc(!context.flags.template condition<Condition::Zero>());			return;
		case Operation::JBE:	jcc(context.flags.template condition<Condition::BelowOrEqual>());	return;
		case Operation::JNBE:	jcc(!context.flags.template condition<Condition::BelowOrEqual>());	return;
		case Operation::JS:		jcc(context.flags.template condition<Condition::Sign>());			return;
		case Operation::JNS:	jcc(!context.flags.template condition<Condition::Sign>());			return;
		case Operation::JP:		jcc(!context.flags.template condition<Condition::ParityOdd>());		return;
		case Operation::JNP:	jcc(context.flags.template condition<Condition::ParityOdd>());		return;
		case Operation::JL:		jcc(context.flags.template condition<Condition::Less>());			return;
		case Operation::JNL:	jcc(!context.flags.template condition<Condition::Less>());			return;
		case Operation::JLE:	jcc(context.flags.template condition<Condition::LessOrEqual>());	return;
		case Operation::JNLE:	jcc(!context.flags.template condition<Condition::LessOrEqual>());	return;

		case Operation::RCL:	Primitive::rcl<IntT>(destination_rmw(), shift_count(), context);	break;
		case Operation::RCR:	Primitive::rcr<IntT>(destination_rmw(), shift_count(), context);	break;
		case Operation::ROL:	Primitive::rol<IntT>(destination_rmw(), shift_count(), context);	break;
		case Operation::ROR:	Primitive::ror<IntT>(destination_rmw(), shift_count(), context);	break;
		case Operation::SAL:	Primitive::sal<IntT>(destination_rmw(), shift_count(), context);	break;
		case Operation::SAR:	Primitive::sar<IntT>(destination_rmw(), shift_count(), context);	break;
		case Operation::SHR:	Primitive::shr<IntT>(destination_rmw(), shift_count(), context);	break;

		case Operation::CLC:	Primitive::clc(context);				return;
		case Operation::CLD:	Primitive::cld(context);				return;
		case Operation::CLI:	Primitive::cli(context);				return;
		case Operation::STC:	Primitive::stc(context);				return;
		case Operation::STD:	Primitive::std(context);				return;
		case Operation::STI:	Primitive::sti(context);				return;
		case Operation::CMC:	Primitive::cmc(context);				return;

		case Operation::XCHG:	Primitive::xchg<IntT>(destination_rmw(), source_rmw());		break;

		case Operation::SALC:	Primitive::salc(context.registers.al(), context);			return;
		case Operation::SETMO:
			if constexpr (ContextT::model == Model::i8086) {
				Primitive::setmo<IntT>(destination_w(), context);
				break;
			} else {
				static_assert(int(Operation::SETMO) == int(Operation::ENTER));
				Primitive::enter<IntT>(instruction, context);
			}
		return;
		case Operation::SETMOC:
			if constexpr (ContextT::model == Model::i8086) {
				// Test CL out here to avoid taking a reference to memory if
				// no write is going to occur.
				if(context.registers.cl()) {
					Primitive::setmo<IntT>(destination_w(), context);
				}
				break;
			} else {
				static_assert(int(Operation::SETMOC) == int(Operation::BOUND));
				Primitive::bound<IntT>(instruction, destination_r(), source_r(), context);
			}
		return;

		case Operation::OUT: Primitive::out<IntT>(port(instruction.destination().source()), pair_low(), context);	return;
		case Operation::IN:	 Primitive::in<IntT>(port(instruction.source().source()), pair_low(), context);			return;

		case Operation::XLAT:	Primitive::xlat<AddressT>(instruction, context);		return;

		case Operation::POP:
			destination_w() = Primitive::pop<IntT, false>(context);
			if constexpr (std::is_same_v<IntT, uint16_t>) {
				context.segments.did_update(instruction.destination().source());
			}
		break;
		case Operation::PUSH:
			Primitive::push<IntT, false>(source_rmw(), context);	// PUSH SP modifies SP before pushing it;
																	// hence PUSH is sometimes read-modify-write.
		break;

		case Operation::POPF:
			if constexpr (std::is_same_v<IntT, uint16_t> || std::is_same_v<IntT, uint32_t>) {
				Primitive::popf(context);
			}
		return;
		case Operation::PUSHF:
			if constexpr (std::is_same_v<IntT, uint16_t> || std::is_same_v<IntT, uint32_t>) {
				Primitive::pushf(context);
			}
		return;
		case Operation::POPA:
			if constexpr (std::is_same_v<IntT, uint16_t> || std::is_same_v<IntT, uint32_t>) {
				Primitive::popa<IntT>(context);
			}
		return;
		case Operation::PUSHA:
			if constexpr (std::is_same_v<IntT, uint16_t> || std::is_same_v<IntT, uint32_t>) {
				Primitive::pusha<IntT>(context);
			}
		return;

		case Operation::CMPS:
			Primitive::cmps<IntT, AddressT, Repetition::None>(instruction, eCX(), eSI(), eDI(), context);
		return;
		case Operation::CMPS_REPE:
			Primitive::cmps<IntT, AddressT, Repetition::RepE>(instruction, eCX(), eSI(), eDI(), context);
		return;
		case Operation::CMPS_REPNE:
			Primitive::cmps<IntT, AddressT, Repetition::RepNE>(instruction, eCX(), eSI(), eDI(), context);
		return;

		case Operation::SCAS:
			Primitive::scas<IntT, AddressT, Repetition::None>(eCX(), eDI(), pair_low(), context);
		return;
		case Operation::SCAS_REPE:
			Primitive::scas<IntT, AddressT, Repetition::RepE>(eCX(), eDI(), pair_low(), context);
		return;
		case Operation::SCAS_REPNE:
			Primitive::scas<IntT, AddressT, Repetition::RepNE>(eCX(), eDI(), pair_low(), context);
		return;

		case Operation::LODS:
			Primitive::lods<IntT, AddressT, Repetition::None>(instruction, eCX(), eSI(), pair_low(), context);
		return;
		case Operation::LODS_REP:
			Primitive::lods<IntT, AddressT, Repetition::Rep>(instruction, eCX(), eSI(), pair_low(), context);
		return;

		case Operation::MOVS:
			Primitive::movs<IntT, AddressT, Repetition::None>(instruction, eCX(), eSI(), eDI(), context);
		break;
		case Operation::MOVS_REP:
			Primitive::movs<IntT, AddressT, Repetition::Rep>(instruction, eCX(), eSI(), eDI(), context);
		break;

		case Operation::STOS:
			Primitive::stos<IntT, AddressT, Repetition::None>(eCX(), eDI(), pair_low(), context);
		break;
		case Operation::STOS_REP:
			Primitive::stos<IntT, AddressT, Repetition::Rep>(eCX(), eDI(), pair_low(), context);
		break;

		case Operation::OUTS:
			Primitive::outs<IntT, AddressT, Repetition::None>(instruction, eCX(), context.registers.dx(), eSI(), context);
		return;
		case Operation::OUTS_REP:
			Primitive::outs<IntT, AddressT, Repetition::Rep>(instruction, eCX(), context.registers.dx(), eSI(), context);
		return;

		case Operation::INS:
			Primitive::ins<IntT, AddressT, Repetition::None>(eCX(), context.registers.dx(), eDI(), context);
		break;
		case Operation::INS_REP:
			Primitive::ins<IntT, AddressT, Repetition::Rep>(eCX(), context.registers.dx(), eDI(), context);
		break;
	}

	// Write to memory if required to complete this operation.
	//
	// This is not currently handled via RAII because of the amount of context that would need to place onto the stack;
	// instead code has been set up to make sure there is only at most one writeable target on loan for potential
	// write back. I might flip-flop on this, especially if I can verify whether extra stack context is easily
	// optimised out.
	context.memory.template write_back<IntT>();
}